

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::flush_variable_declaration(CompilerGLSL *this,uint32_t id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StorageClass SVar2;
  Variant *pVVar3;
  ulong uVar4;
  bool bVar5;
  uint32_t uVar6;
  SPIRVariable *var;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string expr;
  string initializer;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar4].type == TypeVariable)) {
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar4);
  }
  else {
    var = (SPIRVariable *)0x0;
  }
  if (var != (SPIRVariable *)0x0) {
    if (var->deferred_declaration == true) {
      paVar1 = &local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)paVar1;
      if ((((this->options).force_zero_initialized_variables == true) &&
          (var->storage - Private < 3)) && ((var->initializer).id == 0)) {
        type = Compiler::get_variable_data_type(&this->super_Compiler,var);
        bVar5 = type_can_zero_initialize(this,type);
        if (bVar5) {
          uVar6 = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this->super_Compiler)._vptr_Compiler;
          (**(code **)((long)&ts_1[0xe].field_2 + 8))(local_48,this,uVar6);
          join<char_const(&)[4],std::__cxx11::string>
                    (&local_88,(spirv_cross *)0x3a613c,(char (*) [4])local_48,ts_1);
          ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if (local_48[0] != local_38) {
            operator_delete(local_48[0]);
          }
        }
      }
      SVar2 = var->storage;
      var->storage = Function;
      (*(this->super_Compiler)._vptr_Compiler[0x28])(&local_88,this,var);
      var->storage = SVar2;
      statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_88,&local_68,(char (*) [2])0x3a5fd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      var->deferred_declaration = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    emit_variable_temporary_copies(this,var);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_variable_declaration(uint32_t id)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->deferred_declaration)
	{
		string initializer;
		if (options.force_zero_initialized_variables &&
		    (var->storage == StorageClassFunction || var->storage == StorageClassGeneric ||
		     var->storage == StorageClassPrivate) &&
		    !var->initializer && type_can_zero_initialize(get_variable_data_type(*var)))
		{
			initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(*var)));
		}

		statement(variable_decl_function_local(*var), initializer, ";");
		var->deferred_declaration = false;
	}
	if (var)
	{
		emit_variable_temporary_copies(*var);
	}
}